

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

String * __thiscall
glcts::ShaderStorageBufferLayoutBindingCase::buildLayout
          (String *__return_storage_ptr__,ShaderStorageBufferLayoutBindingCase *this,String *binding
          )

{
  ulong uVar1;
  ostream *poVar2;
  undefined1 local_198 [8];
  ostringstream s;
  String *binding_local;
  ShaderStorageBufferLayoutBindingCase *this_local;
  
  s._368_8_ = binding;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)local_198,"layout(binding=");
    poVar2 = std::operator<<(poVar2,(string *)s._368_8_);
    std::operator<<(poVar2,", std430) ");
  }
  else {
    std::operator<<((ostream *)local_198,"layout(std430) ");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

String buildLayout(const String& binding)
	{
		std::ostringstream s;
		if (!binding.empty())
			s << "layout(binding=" << binding << ", std430) ";
		else
			s << "layout(std430) ";
		return s.str();
	}